

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::SharedMinimizeData::imp
          (SharedMinimizeData *this,wsum_t *lhs,LevelWeight *w,wsum_t *rhs,uint32 *lev)

{
  uint32 uVar1;
  long in_RCX;
  uint *in_RDX;
  long in_RSI;
  uint *in_R8;
  bool bVar2;
  wsum_t temp;
  uint32 end;
  uint32 i;
  long local_40;
  uint local_34;
  uint *local_20;
  
  while( true ) {
    bVar2 = false;
    if (*in_R8 != (*in_RDX & 0x7fffffff)) {
      bVar2 = *(long *)(in_RSI + (ulong)*in_R8 * 8) == *(long *)(in_RCX + (ulong)*in_R8 * 8);
    }
    if (!bVar2) break;
    *in_R8 = *in_R8 + 1;
  }
  local_34 = *in_R8;
  uVar1 = numRules((SharedMinimizeData *)0x1ad919);
  local_20 = in_RDX;
  while( true ) {
    if (local_34 == uVar1) {
      return false;
    }
    local_40 = *(long *)(in_RSI + (ulong)local_34 * 8);
    if ((local_34 == (*local_20 & 0x7fffffff)) &&
       (local_40 = (int)local_20[1] + local_40, (int)*local_20 < 0)) {
      local_20 = local_20 + 2;
    }
    if (local_40 != *(long *)(in_RCX + (ulong)local_34 * 8)) break;
    local_34 = local_34 + 1;
  }
  return *(long *)(in_RCX + (ulong)local_34 * 8) < local_40;
}

Assistant:

bool SharedMinimizeData::imp(wsum_t* lhs, const LevelWeight* w, const wsum_t* rhs, uint32& lev) const {
	assert(lev <= w->level && std::equal(lhs, lhs+lev, rhs));
	while (lev != w->level && lhs[lev] == rhs[lev]) { ++lev; }
	for (uint32 i = lev, end = numRules(); i != end; ++i) {
		wsum_t temp = lhs[i];
		if (i == w->level) { temp += w->weight; if (w->next) ++w; }
		if (temp != rhs[i]){ return temp > rhs[i]; }
	}
	return false;
}